

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O0

bool __thiscall AInventory::CallTryPickup(AInventory *this,AActor *toucher,AActor **toucher_return)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  AInventory *pAVar5;
  AInventory *titem;
  bool res;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 aStack_30;
  TObjPtr<AInventory> Invstack;
  AActor **toucher_return_local;
  AActor *toucher_local;
  AInventory *this_local;
  
  Invstack.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1)toucher_return;
  toucher_return_local = (AActor **)toucher;
  toucher_local = &this->super_AActor;
  TObjPtr<AInventory>::TObjPtr
            ((TObjPtr<AInventory> *)&stack0xffffffffffffffd0,&(this->super_AActor).Inventory);
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)((long)&titem + 4),
             (int)toucher_return_local + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE))
  ;
  uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&titem + 4));
  if (uVar3 == 0) {
    bVar1 = CanPickup(this,(AActor *)toucher_return_local);
    if (bVar1) {
      iVar4 = (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x41])
                        (this,&toucher_return_local);
      bVar2 = (byte)iVar4;
    }
    else {
      if ((this->ItemFlags & 0x80000) != 0) {
        return false;
      }
      iVar4 = (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x42])
                        (this,&toucher_return_local);
      bVar2 = (byte)iVar4;
    }
    titem._3_1_ = bVar2 & 1;
    if (Invstack.field_0 != (AInventory *)0x0) {
      *(AActor ***)Invstack.field_0 = toucher_return_local;
    }
    if (((titem._3_1_ == 0) && ((this->ItemFlags & 0x400) != 0)) &&
       (uVar3 = (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x27])(),
       (uVar3 & 1) == 0)) {
      titem._3_1_ = 1;
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x36])();
    }
    if (((titem._3_1_ & 1) != 0) &&
       (GiveQuest(this,(AActor *)toucher_return_local), (this->ItemFlags & 0x1000000) != 0)) {
      while (pAVar5 = ::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&stack0xffffffffffffffd0),
            pAVar5 != (AInventory *)0x0) {
        pAVar5 = ::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&stack0xffffffffffffffd0);
        aStack_30 = (pAVar5->super_AActor).Inventory.field_0;
        bVar1 = TObjPtr<AActor>::operator==(&pAVar5->Owner,&this->super_AActor);
        if ((bVar1) &&
           (bVar1 = CallTryPickup(pAVar5,(AActor *)toucher_return_local,(AActor **)0x0), !bVar1)) {
          (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
        }
      }
    }
    this_local._7_1_ = (bool)(titem._3_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AInventory::CallTryPickup (AActor *toucher, AActor **toucher_return)
{
	TObjPtr<AInventory> Invstack = Inventory; // A pointer of the inventories item stack.

	// unmorphed versions of a currently morphed actor cannot pick up anything. 
	if (toucher->flags & MF_UNMORPHED) return false;

	bool res;
	if (CanPickup(toucher))
		res = TryPickup(toucher);
	else if (!(ItemFlags & IF_RESTRICTABSOLUTELY))
		res = TryPickupRestricted(toucher);	// let an item decide for itself how it will handle this
	else
		return false;

	// Morph items can change the toucher so we need an option to return this info.
	if (toucher_return != NULL) *toucher_return = toucher;

	if (!res && (ItemFlags & IF_ALWAYSPICKUP) && !ShouldStay())
	{
		res = true;
		GoAwayAndDie();
	}

	if (res)
	{
		GiveQuest(toucher);

		// Transfer all inventory accross that the old object had, if requested.
		if ((ItemFlags & IF_TRANSFER))
		{
			while (Invstack)
			{
				AInventory* titem = Invstack;
				Invstack = titem->Inventory;
				if (titem->Owner == this)
				{
					if (!titem->CallTryPickup(toucher)) // The object no longer can exist
					{
						titem->Destroy();
					}
				}
			}
		}
	}
	return res;
}